

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<kj::String&,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,String *params,char (*params_1) [3])

{
  ArrayPtr<const_char> *pAVar1;
  ArrayPtr<const_char> *params_1_00;
  ArrayPtr<const_char> local_38;
  ArrayPtr<const_char> *local_28;
  undefined1 *local_20;
  
  pAVar1 = *(ArrayPtr<const_char> **)(this + 8);
  params_1_00 = pAVar1;
  if (pAVar1 != (ArrayPtr<const_char> *)0x0) {
    params_1_00 = *(ArrayPtr<const_char> **)this;
  }
  local_20 = (undefined1 *)0x0;
  if (pAVar1 != (ArrayPtr<const_char> *)0x0) {
    local_20 = (undefined1 *)((long)&pAVar1[-1].size_ + 7);
  }
  local_28 = params_1_00;
  local_38.size_ = strlen((char *)params);
  local_38.ptr = (char *)params;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,&local_38,params_1_00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}